

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_detail.h
# Opt level: O0

int __thiscall
lf::io::detail1::numNodesAdapted_impl_1::operator()(numNodesAdapted_impl_1 *this,ElementType *a0)

{
  int iVar1;
  ElementType *a0_local;
  numNodesAdapted_impl_1 *this_local;
  
  iVar1 = NumNodes(*a0);
  return iVar1;
}

Assistant:

BOOST_PHOENIX_ADAPT_FUNCTION(int, numNodesAdapted, NumNodes, 1);
}  // namespace lf::io

/// \cond
namespace boost::spirit::traits {

template <class Enum, class RawValue>
struct assign_to_attribute_from_value<
    Enum, RawValue,
    typename std::enable_if_t<std::is_enum_v<Enum> &&
                              !std::is_same_v<Enum, RawValue>>> {
  static void call(RawValue const& raw, Enum& cat) {
    if constexpr (detail::has_value_type<RawValue>::value) {  // NOLINT
      // specialization for endian::endian
      const typename RawValue::value_type value = raw;
      cat = static_cast<Enum>(value);
    } else {  // NOLINT
      cat = static_cast<Enum>(raw);
    }
  }
};

}